

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
::
emplace_decomposable<std::__cxx11::string,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<std::shared_ptr<cs::name_space>&>>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval,piecewise_construct_t *args,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_1,tuple<std::shared_ptr<cs::name_space>_&> *args_2)

{
  long lVar1;
  size_t i;
  pair<unsigned_long,_bool> pVar2;
  
  pVar2 = find_or_prepare_insert<std::__cxx11::string>(this,key,hashval);
  i = pVar2.first;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    __gnu_cxx::new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>
    ::
    construct<std::pair<std::__cxx11::string,std::shared_ptr<cs::name_space>>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<std::shared_ptr<cs::name_space>&>>
              ((new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>
                *)(this + 0x28),
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                *)(i * 0x30 + *(long *)(this + 8)),args,args_1,args_2);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                *)this,i,(byte)hashval & 0x7f);
  }
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)this + i);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 0x30 + lVar1);
  __return_storage_ptr__->second = pVar2.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval,
			        Args&&... args)
			{
				auto res = find_or_prepare_insert(key, hashval);
				if (res.second) {
					emplace_at(res.first, std::forward<Args>(args)...);
					this->set_ctrl(res.first, H2(hashval));
				}
				return {iterator_at(res.first), res.second};
			}